

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall cppcms::xss::uri_parser::hier_part(uri_parser *this)

{
  bool bVar1;
  uri_parser *in_RDI;
  save_point sp;
  byte local_43;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  uri_parser *in_stack_ffffffffffffffe0;
  uri_parser *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  save_point::save_point((save_point *)&stack0xffffffffffffffe0,in_RDI);
  bVar1 = follows((uri_parser *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                  (char *)in_RDI);
  if (bVar1) {
    bVar1 = authority((uri_parser *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if ((bVar1) && (bVar1 = path_abempty(in_stack_ffffffffffffffe0), bVar1)) {
      save_point::commit((save_point *)&stack0xffffffffffffffe0);
      local_43 = 1;
      bVar1 = true;
    }
    else {
      local_43 = 0;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
    local_43 = in_stack_ffffffffffffffff;
  }
  save_point::~save_point((save_point *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    bVar1 = path_absolute(in_stack_ffffffffffffffe8);
    if (!bVar1) {
      path_rootless(in_stack_ffffffffffffffe8);
    }
    local_43 = 1;
  }
  return (bool)(local_43 & 1);
}

Assistant:

bool hier_part()
		{
			{
				save_point sp(this);
				if(follows("//")) {
					if(!authority() || !path_abempty()) 
						return false;
					sp.commit();
					return true;
				}
			}

			return path_absolute() || path_rootless() || true;
		}